

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O2

bool __thiscall trieste::wf::Sequence::check(Sequence *this,Node *node)

{
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  unsigned_long local_220;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_218;
  string local_208;
  string local_1e8;
  Log local_1c8;
  
  peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = &((peVar4->children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
  bVar3 = true;
  bVar6 = false;
  for (p_Var5 = &((peVar4->children).
                  super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>; p_Var5 != p_Var1;
      p_Var5 = p_Var5 + 1) {
    bVar2 = !bVar6;
    bVar6 = true;
    if (bVar2) {
      bVar6 = (p_Var5->_M_ptr->type_).def == (TokenDef *)Error;
    }
    CLI::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_218,p_Var5);
    bVar2 = Choice::check(&this->choice,(Node *)&local_218);
    bVar3 = (bool)(bVar3 & bVar2);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
  }
  if (!bVar6) {
    peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((ulong)((long)(peVar4->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar4->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) < this->minlen) {
      local_1c8.print = Silent;
      if (1 < logging::detail::report_level) {
        logging::Log::start(&local_1c8,Error);
        peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      Location::origin_linecol_abi_cxx11_(&local_1e8,&peVar4->location_);
      bVar6 = true;
      if (local_1c8.print != Silent) {
        logging::append<std::__cxx11::string>(&local_1c8,&local_1e8);
        if (local_1c8.print != Silent) {
          logging::append<char[21]>(&local_1c8,(char (*) [21])": expected at least ");
          if (local_1c8.print != Silent) {
            logging::append<unsigned_long>(&local_1c8,&this->minlen);
            if (local_1c8.print != Silent) {
              logging::append<char[18]>(&local_1c8,(char (*) [18])0x1e7829);
              bVar6 = local_1c8.print == Silent;
            }
          }
        }
      }
      peVar4 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_220 = (long)(peVar4->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar4->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (!bVar6) {
        logging::append<unsigned_long>(&local_1c8,&local_220);
        if (local_1c8.print != Silent) {
          logging::Log::operation(&local_1c8,std::endl<char,std::char_traits<char>>);
        }
      }
      Location::str_abi_cxx11_
                (&local_208,
                 &((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->location_);
      if (local_1c8.print != Silent) {
        logging::append<std::__cxx11::string>(&local_1c8,&local_208);
        if (local_1c8.print != Silent) {
          logging::append<std::shared_ptr<trieste::NodeDef>>(&local_1c8,node);
          if (local_1c8.print != Silent) {
            logging::Log::operation(&local_1c8,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (local_1c8.print != Silent) {
        logging::Log::end(&local_1c8);
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool check(Node node) const
      {
        auto has_err = false;
        auto ok = true;

        for (auto& child : *node)
        {
          has_err = has_err || (child == Error);
          ok = choice.check(child) && ok;
        }

        if (!has_err && (node->size() < minlen))
        {
          logging::Error() << node->location().origin_linecol()
                           << ": expected at least " << minlen
                           << " children, found " << node->size() << std::endl
                           << node->location().str() << node << std::endl;
          ok = false;
        }

        return ok;
      }